

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_describe_load_balancer_attribute.cc
# Opt level: O3

int __thiscall
aliyun::Slb::DescribeLoadBalancerAttribute
          (Slb *this,SlbDescribeLoadBalancerAttributeRequestType *req,
          SlbDescribeLoadBalancerAttributeResponseType *response,SlbErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Int IVar5;
  ArrayIndex AVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  Value *pVVar12;
  size_type *psVar13;
  uint uVar14;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  undefined1 local_440 [8];
  _Alloc_hider local_438;
  undefined1 local_430 [24];
  Value local_418;
  string local_400;
  long *local_3e0;
  long local_3d8;
  long local_3d0 [2];
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  local_3c0._M_string_length = 0;
  local_3c0.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_3e0 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e0,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_400);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_418);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_3e0,local_3d8 + (long)local_3e0);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_3a0.field_2._M_allocated_capacity = *psVar13;
    local_3a0.field_2._8_8_ = plVar8[3];
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  }
  else {
    local_3a0.field_2._M_allocated_capacity = *psVar13;
    local_3a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_3a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_418,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"DescribeLoadBalancerAttribute","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar2 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar2 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar2 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar2,pcVar2 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->load_balancer_id)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"LoadBalancerId","");
    pcVar2 = (req->load_balancer_id)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar2,pcVar2 + (req->load_balancer_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"OwnerAccount","");
    pcVar2 = (req->owner_account)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar2,pcVar2 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_440);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_3c0);
    if (((0 < iVar4) && (local_3c0._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_3c0,&local_418,true), bVar3)) {
      if (error_info != (SlbErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_418,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
        }
        else {
          local_440 = (undefined1  [8])local_430;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_440,anon_var_dwarf_27cd8e + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_440);
        if (local_440 != (undefined1  [8])local_430) {
          operator_delete((void *)local_440,local_430._0_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_418,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
        }
        else {
          local_440 = (undefined1  [8])local_430;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_440,anon_var_dwarf_27cd8e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_440);
        if (local_440 != (undefined1  [8])local_430) {
          operator_delete((void *)local_440,local_430._0_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_418,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
        }
        else {
          local_440 = (undefined1  [8])local_430;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_440,anon_var_dwarf_27cd8e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_440);
        if (local_440 != (undefined1  [8])local_430) {
          operator_delete((void *)local_440,local_430._0_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_418,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
        }
        else {
          local_440 = (undefined1  [8])local_430;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_440,anon_var_dwarf_27cd8e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_440);
        if (local_440 != (undefined1  [8])local_430) {
          operator_delete((void *)local_440,local_430._0_8_ + 1);
        }
      }
      if (response != (SlbDescribeLoadBalancerAttributeResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_418,"LoadBalancerId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"LoadBalancerId");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->load_balancer_id,(string *)local_440)
          ;
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"LoadBalancerName");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"LoadBalancerName");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=
                    ((string *)&response->load_balancer_name,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"LoadBalancerStatus");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"LoadBalancerStatus");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=
                    ((string *)&response->load_balancer_status,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"RegionId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"RegionId");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->region_id,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"RegionIdAlias");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"RegionIdAlias");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->region_id_alias,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"Address");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"Address");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->address,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"AddressType");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"AddressType");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->address_type,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"VpcId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"VpcId");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->vpc_id,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"VSwitchId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"VSwitchId");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->vswitch_id,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"NetworkType");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"NetworkType");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->network_type,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"InternetChargeType");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"InternetChargeType");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=
                    ((string *)&response->internet_charge_type,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"Bandwidth");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"Bandwidth");
          IVar5 = Json::Value::asInt(pVVar10);
          response->bandwidth = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_418,"SysBandwidth");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"SysBandwidth");
          IVar5 = Json::Value::asInt(pVVar10);
          response->sys_bandwidth = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_418,"CreateTime");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"CreateTime");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->create_time,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"CreateTimeStamp");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"CreateTimeStamp");
          IVar5 = Json::Value::asInt(pVVar10);
          response->create_time_stamp = (long)IVar5;
        }
        bVar3 = Json::Value::isMember(&local_418,"MasterZoneId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"MasterZoneId");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->master_zone_id,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"SlaveZoneId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"SlaveZoneId");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->slave_zone_id,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"MaxConnLimit");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"MaxConnLimit");
          IVar5 = Json::Value::asInt(pVVar10);
          response->max_conn_limit = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_418,"SecurityStatus");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"SecurityStatus");
          Json::Value::asString_abi_cxx11_((string *)local_440,pVVar10);
          std::__cxx11::string::operator=((string *)&response->security_status,(string *)local_440);
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440,local_430._0_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"ListenerPortsAndProtocal");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"ListenerPortsAndProtocal");
          bVar3 = Json::Value::isMember(pVVar10,"ListenerPortAndProtocal");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_418,"ListenerPortsAndProtocal");
            pVVar10 = Json::Value::operator[](pVVar10,"ListenerPortAndProtocal");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
              uVar14 = 0;
              do {
                local_430._0_8_ = 0;
                local_430[8] = '\0';
                local_438._M_p = local_430 + 8;
                pVVar11 = Json::Value::operator[](pVVar10,uVar14);
                bVar3 = Json::Value::isMember(pVVar11,"ListenerPort");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ListenerPort");
                  IVar5 = Json::Value::asInt(pVVar12);
                  local_440._0_4_ = IVar5;
                }
                bVar3 = Json::Value::isMember(pVVar11,"ListenerProtocal");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar11,"ListenerProtocal");
                  Json::Value::asString_abi_cxx11_(&local_400,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_438,(string *)&local_400);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_400._M_dataplus._M_p != &local_400.field_2) {
                    operator_delete(local_400._M_dataplus._M_p,
                                    CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                                             local_400.field_2._M_local_buf[0]) + 1);
                  }
                }
                std::
                vector<aliyun::SlbDescribeLoadBalancerAttributeListenerPortAndProtocalType,_std::allocator<aliyun::SlbDescribeLoadBalancerAttributeListenerPortAndProtocalType>_>
                ::push_back(&response->listener_ports_and_protocal,(value_type *)local_440);
                if (local_438._M_p != local_430 + 8) {
                  operator_delete(local_438._M_p,CONCAT71(local_430._9_7_,local_430[8]) + 1);
                }
                AVar6 = Json::Value::size(pVVar10);
                uVar14 = uVar14 + 1;
              } while (uVar14 < AVar6);
            }
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"ListenerPortsAndProtocol");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"ListenerPortsAndProtocol");
          bVar3 = Json::Value::isMember(pVVar10,"ListenerPortAndProtocol");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_418,"ListenerPortsAndProtocol");
            pVVar10 = Json::Value::operator[](pVVar10,"ListenerPortAndProtocol");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
              uVar14 = 0;
              do {
                local_430._0_8_ = 0;
                local_430[8] = '\0';
                local_438._M_p = local_430 + 8;
                pVVar11 = Json::Value::operator[](pVVar10,uVar14);
                bVar3 = Json::Value::isMember(pVVar11,"ListenerPort");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ListenerPort");
                  IVar5 = Json::Value::asInt(pVVar12);
                  local_440._0_4_ = IVar5;
                }
                bVar3 = Json::Value::isMember(pVVar11,"ListenerProtocol");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar11,"ListenerProtocol");
                  Json::Value::asString_abi_cxx11_(&local_400,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_438,(string *)&local_400);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_400._M_dataplus._M_p != &local_400.field_2) {
                    operator_delete(local_400._M_dataplus._M_p,
                                    CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                                             local_400.field_2._M_local_buf[0]) + 1);
                  }
                }
                std::
                vector<aliyun::SlbDescribeLoadBalancerAttributeListenerPortAndProtocolType,_std::allocator<aliyun::SlbDescribeLoadBalancerAttributeListenerPortAndProtocolType>_>
                ::push_back(&response->listener_ports_and_protocol,(value_type *)local_440);
                if (local_438._M_p != local_430 + 8) {
                  operator_delete(local_438._M_p,CONCAT71(local_430._9_7_,local_430[8]) + 1);
                }
                AVar6 = Json::Value::size(pVVar10);
                uVar14 = uVar14 + 1;
              } while (uVar14 < AVar6);
            }
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"BackendServers");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"BackendServers");
          bVar3 = Json::Value::isMember(pVVar10,"BackendServer");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_418,"BackendServers");
            pVVar10 = Json::Value::operator[](pVVar10,"BackendServer");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
              uVar14 = 0;
              do {
                local_438._M_p = (pointer)0x0;
                local_430._0_8_ = local_430._0_8_ & 0xffffffffffffff00;
                local_440 = (undefined1  [8])local_430;
                pVVar11 = Json::Value::operator[](pVVar10,uVar14);
                bVar3 = Json::Value::isMember(pVVar11,"ServerId");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ServerId");
                  Json::Value::asString_abi_cxx11_(&local_400,pVVar12);
                  std::__cxx11::string::operator=((string *)local_440,(string *)&local_400);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_400._M_dataplus._M_p != &local_400.field_2) {
                    operator_delete(local_400._M_dataplus._M_p,
                                    CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                                             local_400.field_2._M_local_buf[0]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"Weight");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar11,"Weight");
                  local_430._16_4_ = Json::Value::asInt(pVVar11);
                }
                std::
                vector<aliyun::SlbDescribeLoadBalancerAttributeBackendServerType,_std::allocator<aliyun::SlbDescribeLoadBalancerAttributeBackendServerType>_>
                ::push_back(&response->backend_servers,(value_type *)local_440);
                if (local_440 != (undefined1  [8])local_430) {
                  operator_delete((void *)local_440,local_430._0_8_ + 1);
                }
                AVar6 = Json::Value::size(pVVar10);
                uVar14 = uVar14 + 1;
              } while (uVar14 < AVar6);
            }
          }
        }
        bVar3 = Json::Value::isMember(&local_418,"ListenerPorts");
        iVar4 = 200;
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_418,"ListenerPorts");
          bVar3 = Json::Value::isMember(pVVar10,"ListenerPort");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_418,"ListenerPorts");
            pVVar10 = Json::Value::operator[](pVVar10,"ListenerPort");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
              uVar14 = 0;
              do {
                local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
                local_400._M_string_length = 0;
                local_400.field_2._M_local_buf[0] = '\0';
                pVVar11 = Json::Value::operator[](pVVar10,uVar14);
                Json::Value::asString_abi_cxx11_((string *)local_440,pVVar11);
                std::__cxx11::string::operator=((string *)&local_400,(string *)local_440);
                if (local_440 != (undefined1  [8])local_430) {
                  operator_delete((void *)local_440,local_430._0_8_ + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&response->listener_ports,&local_400);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_400._M_dataplus._M_p != &local_400.field_2) {
                  operator_delete(local_400._M_dataplus._M_p,
                                  CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                                           local_400.field_2._M_local_buf[0]) + 1);
                }
                AVar6 = Json::Value::size(pVVar10);
                uVar14 = uVar14 + 1;
              } while (uVar14 < AVar6);
            }
          }
        }
      }
      goto LAB_0013b140;
    }
    if (error_info == (SlbErrorInfo *)0x0) goto LAB_0013b13b;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (SlbErrorInfo *)0x0) {
LAB_0013b13b:
      iVar4 = -1;
      goto LAB_0013b140;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_0013b140:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_418);
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0,local_3d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,
                    CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                             local_3c0.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Slb::DescribeLoadBalancerAttribute(const SlbDescribeLoadBalancerAttributeRequestType& req,
                      SlbDescribeLoadBalancerAttributeResponseType* response,
                       SlbErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeLoadBalancerAttribute");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.load_balancer_id.empty()) {
    req_rpc->AddRequestQuery("LoadBalancerId", req.load_balancer_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}